

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Process.cpp
# Opt level: O1

int ProcessThread::shutdown(int __fd,int __how)

{
  bool bVar1;
  int in_EAX;
  undefined7 extraout_var;
  
  if (sProcessThread != (ProcessThread *)0x0) {
    wakeup(Stop);
    bVar1 = Thread::join(&sProcessThread->super_Thread);
    in_EAX = (int)CONCAT71(extraout_var,bVar1);
    if (sProcessThread != (ProcessThread *)0x0) {
      in_EAX = (*(sProcessThread->super_Thread)._vptr_Thread[1])();
    }
    sProcessThread = (ProcessThread *)0x0;
  }
  return in_EAX;
}

Assistant:

void ProcessThread::shutdown()
{
    // called from static destructor, can't use mutex
    if (sProcessThread) {
        wakeup(Stop);
        sProcessThread->join();
        delete sProcessThread;
        sProcessThread = 0;
    }
}